

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O1

void __thiscall TcpConnection::do_close(TcpConnection *this)

{
  int __fd;
  TcpServer *this_00;
  TcpConnSP TStack_28;
  
  if ((this->tc_close_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->tc_close_cb)._M_invoker)((_Any_data *)&this->tc_close_cb);
  }
  Epoll::epoll_del((this->tc_loop->el_epoller).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,this->tc_fd);
  BufferBase::clear(&(this->tc_ibuf).super_BufferBase);
  BufferBase::clear(&(this->tc_obuf).super_BufferBase);
  __fd = this->tc_fd;
  this->tc_fd = -1;
  close(__fd);
  this_00 = this->tc_server;
  std::__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TcpConnection,void>
            ((__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&TStack_28,
             (__weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
  TcpServer::do_clean(this_00,&TStack_28);
  if (TStack_28.super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (TStack_28.super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void TcpConnection::do_close() {
    if (tc_close_cb) {
        tc_close_cb();
    }

    tc_loop->del_from_poller(tc_fd);
    tc_ibuf.clear(); 
    tc_obuf.clear();

    int fd = tc_fd;
    tc_fd = -1;
    close(fd);

    tc_server->do_clean(shared_from_this());
}